

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O1

void __thiscall hsql::CreateStatement::~CreateStatement(CreateStatement *this)

{
  vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *pvVar1;
  pointer ppCVar2;
  vector<char_*,_std::allocator<char_*>_> *pvVar3;
  pointer ppcVar4;
  pointer ppCVar5;
  pointer ppcVar6;
  
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__CreateStatement_0012b920;
  free(this->filePath);
  free(this->tableName);
  if (this->select != (SelectStatement *)0x0) {
    (*(this->select->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  pvVar1 = this->columns;
  if (pvVar1 != (vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *)0x0)
  {
    ppCVar2 = (pvVar1->
              super__Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar5 = (pvVar1->
                   super__Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppCVar5 != ppCVar2;
        ppCVar5 = ppCVar5 + 1) {
      if (*ppCVar5 != (ColumnDefinition *)0x0) {
        (*(*ppCVar5)->_vptr_ColumnDefinition[1])();
      }
    }
    pvVar1 = this->columns;
    if (pvVar1 != (vector<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_> *)0x0
       ) {
      ppCVar5 = (pvVar1->
                super__Vector_base<hsql::ColumnDefinition_*,_std::allocator<hsql::ColumnDefinition_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (ppCVar5 != (pointer)0x0) {
        operator_delete(ppCVar5);
      }
      operator_delete(pvVar1);
    }
  }
  pvVar3 = this->viewColumns;
  if (pvVar3 != (vector<char_*,_std::allocator<char_*>_> *)0x0) {
    ppcVar4 = (pvVar3->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar6 = (pvVar3->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppcVar6 != ppcVar4; ppcVar6 = ppcVar6 + 1) {
      free(*ppcVar6);
    }
    pvVar3 = this->viewColumns;
    if (pvVar3 != (vector<char_*,_std::allocator<char_*>_> *)0x0) {
      ppcVar6 = (pvVar3->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (ppcVar6 != (pointer)0x0) {
        operator_delete(ppcVar6);
      }
      operator_delete(pvVar3);
      return;
    }
  }
  return;
}

Assistant:

CreateStatement::~CreateStatement() {
    free(filePath);
    free(tableName);
    delete select;

    if (columns != NULL) {
      for (ColumnDefinition* def : *columns) {
        delete def;
      }
      delete columns;
    }

    if (viewColumns != NULL) {
      for (char* column : *viewColumns) {
        free(column);
      }
      delete viewColumns;
    }
  }